

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result spvc_compiler_msl_add_discrete_descriptor_set(spvc_compiler compiler,uint desc_set)

{
  spvc_context_s *this;
  CompilerMSL *this_00;
  CompilerMSL *msl;
  allocator local_41;
  string local_40;
  uint local_1c;
  spvc_compiler psStack_18;
  uint desc_set_local;
  spvc_compiler compiler_local;
  
  local_1c = desc_set;
  psStack_18 = compiler;
  if (compiler->backend == SPVC_BACKEND_MSL) {
    this_00 = (CompilerMSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              get(&compiler->compiler);
    spirv_cross::CompilerMSL::add_discrete_descriptor_set(this_00,local_1c);
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"MSL function used on a non-MSL backend.",&local_41);
    spvc_context_s::report_error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    compiler_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_msl_add_discrete_descriptor_set(spvc_compiler compiler, unsigned desc_set)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	msl.add_discrete_descriptor_set(desc_set);
	return SPVC_SUCCESS;
#else
	(void)desc_set;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}